

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_wait_ping_resp_timeout(pcp_server_t *s)

{
  pcp_flow_t *ppVar1;
  uint uVar2;
  pcp_flow_state_e pVar3;
  pcp_server_t *s_local;
  
  uVar2 = s->ping_count + 1;
  s->ping_count = uVar2;
  if (uVar2 < 5) {
    if (s->ping_flow_msg == (pcp_flow_t *)0x0) {
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
      s_local._4_4_ = pss_ping;
    }
    else {
      pVar3 = handle_flow_event(s->ping_flow_msg,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
      if (pVar3 == pfs_failed) {
        gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
        s_local._4_4_ = pss_set_not_working;
      }
      else if (s->ping_flow_msg == (pcp_flow_t *)0x0) {
        (s->next_timeout).tv_sec = 0;
        (s->next_timeout).tv_usec = 0;
        s_local._4_4_ = pss_ping;
      }
      else {
        ppVar1 = s->ping_flow_msg;
        (s->next_timeout).tv_sec = (ppVar1->timeout).tv_sec;
        (s->next_timeout).tv_usec = (ppVar1->timeout).tv_usec;
        s_local._4_4_ = pss_wait_ping_resp;
      }
    }
  }
  else {
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    s_local._4_4_ = pss_set_not_working;
  }
  return s_local._4_4_;
}

Assistant:

static pcp_server_state_e handle_wait_ping_resp_timeout(pcp_server_t *s) {
    if (++s->ping_count >= PCP_MAX_PING_COUNT) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    if (!s->ping_flow_msg) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_ping;
    }

    if (handle_flow_event(s->ping_flow_msg, fev_flow_timedout, NULL) ==
        pfs_failed) {
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    if (s->ping_flow_msg) {
        s->next_timeout = s->ping_flow_msg->timeout;
    } else {
        s->next_timeout.tv_sec = 0;
        s->next_timeout.tv_usec = 0;
        return pss_ping;
    }
    return pss_wait_ping_resp;
}